

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

int xercesc_4_0::XMLDateTime::compareOrder(XMLDateTime *lValue,XMLDateTime *rValue)

{
  int local_100;
  int i;
  undefined1 local_f0 [8];
  XMLDateTime rTemp;
  XMLDateTime lTemp;
  XMLDateTime *rValue_local;
  XMLDateTime *lValue_local;
  
  lTemp.fMemoryManager = (MemoryManager *)rValue;
  XMLDateTime((XMLDateTime *)&rTemp.fMemoryManager,lValue);
  XMLDateTime((XMLDateTime *)local_f0,(XMLDateTime *)lTemp.fMemoryManager);
  normalize((XMLDateTime *)&rTemp.fMemoryManager);
  normalize((XMLDateTime *)local_f0);
  for (local_100 = 0; local_100 < 8; local_100 = local_100 + 1) {
    if (lTemp.fValue[(long)local_100 + -2] < rTemp.fValue[(long)local_100 + -2]) {
      lValue_local._4_4_ = -1;
      goto LAB_002bf926;
    }
    if (rTemp.fValue[(long)local_100 + -2] < lTemp.fValue[(long)local_100 + -2]) {
      lValue_local._4_4_ = 1;
      goto LAB_002bf926;
    }
  }
  if ((lTemp.fMilliSecond._0_1_ & 1) != 0) {
    if ((double)lTemp.fBufferMaxLen < (double)rTemp.fBufferMaxLen) {
      lValue_local._4_4_ = -1;
      goto LAB_002bf926;
    }
    if ((double)rTemp.fBufferMaxLen < (double)lTemp.fBufferMaxLen) {
      lValue_local._4_4_ = 1;
      goto LAB_002bf926;
    }
  }
  lValue_local._4_4_ = 0;
LAB_002bf926:
  ~XMLDateTime((XMLDateTime *)local_f0);
  ~XMLDateTime((XMLDateTime *)&rTemp.fMemoryManager);
  return lValue_local._4_4_;
}

Assistant:

int XMLDateTime::compareOrder(const XMLDateTime* const lValue
                            , const XMLDateTime* const rValue)
                            //, MemoryManager* const memMgr)
{
    //
    // If any of the them is not normalized() yet,
    // we need to do something here.
    //
    XMLDateTime lTemp = *lValue;
    XMLDateTime rTemp = *rValue;

    lTemp.normalize();
    rTemp.normalize();

    for ( int i = 0 ; i < TOTAL_SIZE; i++ )
    {
        if ( lTemp.fValue[i] < rTemp.fValue[i] )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fValue[i] > rTemp.fValue[i] )
        {
            return GREATER_THAN;
        }
    }

    if ( lTemp.fHasTime)
    {
        if ( lTemp.fMilliSecond < rTemp.fMilliSecond )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fMilliSecond > rTemp.fMilliSecond )
        {
            return GREATER_THAN;
        }
    }

    return EQUAL;
}